

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

bool __thiscall IR::PropertySymOpnd::ShouldUsePolyEquivTypeGuard(PropertySymOpnd *this,Func *func)

{
  bool bVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  
  bVar1 = IsPoly(this);
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, (char)this->m_polyCacheUtil < '\0')) {
    sourceContextId = Func::GetSourceContextId(func);
    functionId = Func::GetLocalFunctionId(func);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,PolyEquivTypeGuardPhase,sourceContextId,functionId);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool
PropertySymOpnd::ShouldUsePolyEquivTypeGuard(Func *const func) const
{
    return this->IsPoly() && this->m_polyCacheUtil >= PolymorphicInlineCacheUtilizationThreshold && !PHASE_OFF(Js::PolyEquivTypeGuardPhase, func);
}